

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_BrepFace::ON_BrepFace(ON_BrepFace *this,int face_index)

{
  Impl *this_00;
  ON_Interval *local_30;
  int face_index_local;
  ON_BrepFace *this_local;
  
  ON_SurfaceProxy::ON_SurfaceProxy(&this->super_ON_SurfaceProxy,(ON_Surface *)0x0);
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b6bb08;
  this->m_status = ON_ComponentStatus::NoneSet;
  this->m_pack_id_low = 0;
  this->m_face_index = face_index;
  ON_SimpleArray<int>::ON_SimpleArray(&this->m_li);
  this->m_si = -1;
  this->m_bRev = false;
  this->m_reserved2 = '\0';
  this->m_pack_id_high = 0;
  this->m_face_material_channel = 0;
  (this->m_face_uuid).Data1 = 0;
  (this->m_face_uuid).Data2 = 0;
  (this->m_face_uuid).Data3 = 0;
  (this->m_face_uuid).Data4[0] = '\0';
  (this->m_face_uuid).Data4[1] = '\0';
  (this->m_face_uuid).Data4[2] = '\0';
  (this->m_face_uuid).Data4[3] = '\0';
  (this->m_face_uuid).Data4[4] = '\0';
  (this->m_face_uuid).Data4[5] = '\0';
  (this->m_face_uuid).Data4[6] = '\0';
  (this->m_face_uuid).Data4[7] = '\0';
  (this->m_per_face_color).field_0 = ON_Color::UnsetColor.field_0;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  local_30 = (ON_Interval *)&this->field_0x98;
  do {
    ON_Interval::ON_Interval(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (ON_Interval *)&this->m_pImpl);
  this_00 = (Impl *)operator_new(0x58);
  Impl::Impl(this_00);
  this->m_pImpl = this_00;
  this->m_reserved0 = (void *)0x0;
  this->m_reserved1 = (void *)0x0;
  this->m_brep = (ON_Brep *)0x0;
  memset(&this->m_face_user,0,8);
  return;
}

Assistant:

ON_BrepFace::ON_BrepFace(int face_index) 
  : ON_SurfaceProxy(0),
  m_face_index(face_index),
  m_pImpl(new Impl)
{
  memset(&m_face_user,0,sizeof(m_face_user));
}